

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O0

uint mjs::unicode::utf16_code_unit_count(char32_t code_point)

{
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  char32_t code_point_local;
  
  if ((uint)code_point < 0xd800) {
    local_10 = 1;
  }
  else {
    if ((uint)code_point < 0xe000) {
      local_14 = 0;
    }
    else {
      if ((uint)code_point < 0x10000) {
        local_18 = 1;
      }
      else {
        local_18 = 0;
        if ((uint)code_point < 0x110000) {
          local_18 = 2;
        }
      }
      local_14 = local_18;
    }
    local_10 = local_14;
  }
  return local_10;
}

Assistant:

constexpr unsigned utf16_code_unit_count(char32_t code_point) {
    return code_point < utf16_high_surrogate ? 1 :
           code_point <= utf16_last_surrogate ? invalid_length :
           code_point < 0x10000 ? 1 :
           code_point < max_code_point ? 2 : invalid_length;
}